

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VtabBeginParse
               (Parse *pParse,Token *pName1,Token *pName2,Token *pModuleName,int ifNotExists)

{
  sqlite3 *psVar1;
  long lVar2;
  int code;
  undefined8 *in_RCX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  Token *unaff_retaddr;
  Token *in_stack_00000008;
  Parse *in_stack_00000010;
  int in_stack_00000020;
  int iDb;
  sqlite3 *db;
  Table *pTable;
  undefined4 in_stack_ffffffffffffff9c;
  sqlite3 *db_00;
  sqlite3 *db_01;
  char *in_stack_ffffffffffffffb0;
  sqlite3 *zArg;
  Table *in_stack_ffffffffffffffb8;
  sqlite3 *pTable_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  sqlite3 *db_02;
  
  sqlite3StartTable(in_stack_00000010,in_stack_00000008,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),
                    (int)in_RDI,(int)((ulong)in_RSI >> 0x20),in_stack_00000020);
  psVar1 = (sqlite3 *)in_RDI[0x27];
  if (psVar1 != (sqlite3 *)0x0) {
    db_00 = (sqlite3 *)*in_RDI;
    db_01 = psVar1;
    zArg = db_00;
    sqlite3NameFromToken(db_00,(Token *)CONCAT44(in_stack_ffffffffffffff9c,in_R8D));
    addModuleArgument((sqlite3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    addModuleArgument((sqlite3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    pTable_00 = psVar1;
    db_02 = zArg;
    sqlite3DbStrDup(db_01,(char *)db_00);
    addModuleArgument((sqlite3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      (Table *)pTable_00,(char *)zArg);
    *(int *)(in_RDI + 0x1e) = ((int)*in_RCX + *(int *)(in_RCX + 1)) - (int)in_RDI[0x1d];
    lVar2._0_4_ = psVar1->iSysErrno;
    lVar2._4_2_ = psVar1->dbOptFlags;
    lVar2._6_1_ = psVar1->enc;
    lVar2._7_1_ = psVar1->autoCommit;
    if (lVar2 != 0) {
      code = sqlite3SchemaToIndex(db_02,*(Schema **)&psVar1->magic);
      sqlite3AuthCheck((Parse *)db_02,code,(char *)pTable_00,(char *)zArg,(char *)db_01);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabBeginParse(
  Parse *pParse,        /* Parsing context */
  Token *pName1,        /* Name of new table, or database name */
  Token *pName2,        /* Name of new table or NULL */
  Token *pModuleName,   /* Name of the module for the virtual table */
  int ifNotExists       /* No error if the table already exists */
){
  Table *pTable;        /* The new virtual table */
  sqlite3 *db;          /* Database connection */

  sqlite3StartTable(pParse, pName1, pName2, 0, 0, 1, ifNotExists);
  pTable = pParse->pNewTable;
  if( pTable==0 ) return;
  assert( 0==pTable->pIndex );

  db = pParse->db;

  assert( pTable->nModuleArg==0 );
  addModuleArgument(db, pTable, sqlite3NameFromToken(db, pModuleName));
  addModuleArgument(db, pTable, 0);
  addModuleArgument(db, pTable, sqlite3DbStrDup(db, pTable->zName));
  assert( (pParse->sNameToken.z==pName2->z && pName2->z!=0)
       || (pParse->sNameToken.z==pName1->z && pName2->z==0)
  );
  pParse->sNameToken.n = (int)(
      &pModuleName->z[pModuleName->n] - pParse->sNameToken.z
  );

#ifndef SQLITE_OMIT_AUTHORIZATION
  /* Creating a virtual table invokes the authorization callback twice.
  ** The first invocation, to obtain permission to INSERT a row into the
  ** sqlite_master table, has already been made by sqlite3StartTable().
  ** The second call, to obtain permission to create the table, is made now.
  */
  if( pTable->azModuleArg ){
    int iDb = sqlite3SchemaToIndex(db, pTable->pSchema);
    assert( iDb>=0 ); /* The database the table is being created in */
    sqlite3AuthCheck(pParse, SQLITE_CREATE_VTABLE, pTable->zName, 
            pTable->azModuleArg[0], pParse->db->aDb[iDb].zDbSName);
  }
#endif
}